

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O3

method class_get_method_type_safe(vector v,type_id ret,type_id *args,size_t size)

{
  int iVar1;
  long lVar2;
  undefined8 *puVar3;
  signature s;
  method_conflict m;
  long lVar4;
  
  if (v == (vector)0x0) {
    m = (method_conflict)0x0;
  }
  else {
    lVar2 = vector_size();
    if (lVar2 != 0) {
      lVar4 = 0;
      do {
        puVar3 = (undefined8 *)vector_at(v,lVar4);
        m = (method_conflict)*puVar3;
        s = method_signature(m);
        iVar1 = signature_compare(s,ret,args,size);
        if (iVar1 == 0) goto LAB_00107c7a;
        lVar4 = lVar4 + 1;
      } while (lVar2 != lVar4);
    }
    m = (method_conflict)0x0;
LAB_00107c7a:
    vector_destroy(v);
  }
  return m;
}

Assistant:

method class_get_method_type_safe(vector v, type_id ret, type_id args[], size_t size)
{
	if (v != NULL)
	{
		size_t iterator, method_size = vector_size(v);

		for (iterator = 0; iterator < method_size; ++iterator)
		{
			method m = vector_at_type(v, iterator, method);

			if (signature_compare(method_signature(m), ret, args, size) == 0)
			{
				vector_destroy(v);
				return m;
			}
		}

		vector_destroy(v);
	}

	return NULL;
}